

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

pair<const_char_*,_bool> jsoncons::uri::is_pchar(iterator first,iterator last)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *in_RSI;
  char *in_RDI;
  pair<const_char_*,_bool> pVar3;
  pair<const_char_*,_bool> pVar4;
  pair<const_char_*,_bool> result;
  char c;
  string *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool local_91;
  char *local_90;
  const_iterator in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  char *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  bool local_61;
  char *local_60;
  char local_56;
  undefined1 local_55;
  char *local_18;
  pair<const_char_*,_bool> local_10;
  
  if (in_RDI != in_RSI) {
    local_56 = *in_RDI;
    local_18 = in_RDI;
    bVar1 = is_unreserved('\0');
    if (bVar1) {
      local_60 = local_18 + 1;
      local_61 = true;
      std::pair<const_char_*,_bool>::pair<const_char_*,_bool,_true>(&local_10,&local_60,&local_61);
      pVar3._8_8_ = extraout_RDX;
      pVar3.first = local_10.first;
      bVar1 = local_10.second;
    }
    else {
      pVar3 = is_pct_encoded((const_iterator)
                             CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
      bVar1 = pVar3.second;
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_90 = local_18 + 1;
        bVar1 = is_sub_delim(local_56);
        local_91 = true;
        if ((!bVar1) && (local_91 = true, local_56 != ':')) {
          local_91 = local_56 == '@';
        }
        std::pair<const_char_*,_bool>::pair<const_char_*,_bool,_true>(&local_10,&local_90,&local_91)
        ;
        pVar3._8_8_ = extraout_RDX_00;
        pVar3.first = local_10.first;
        bVar1 = local_10.second;
      }
    }
    local_10.second = bVar1;
    local_10.first = pVar3.first;
    pVar4._9_7_ = pVar3._9_7_;
    pVar4.second = local_10.second;
    pVar4.first = local_10.first;
    return pVar4;
  }
  local_55 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,(allocator<char> *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
  assertion_error::assertion_error
            ((assertion_error *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  local_55 = 0;
  __cxa_throw(uVar2,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

static std::pair<string_view::const_iterator,bool> is_pchar(string_view::iterator first, string_view::iterator last)
        {
            JSONCONS_ASSERT(first != last);
            
            const char c = *first;
            if (is_unreserved(c))
            {
                return std::pair<string_view::const_iterator,bool>{first+1,true};
            }
            auto result = is_pct_encoded(first,last);
            if (result.second)
            {
                return result;
            }
            
            return std::pair<string_view::const_iterator,bool>{first+1,is_sub_delim(c) || c == ':' || c == '@'};
        }